

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

void cfd::capi::FreeBufferOnError
               (char **pointer1,char **pointer2,char **pointer3,char **pointer4,char **pointer5,
               char **pointer6)

{
  char **ppcVar1;
  size_t idx;
  long lVar2;
  char **pointer_list [6];
  char **local_48 [7];
  
  local_48[0] = pointer1;
  local_48[1] = pointer2;
  local_48[2] = pointer3;
  local_48[3] = pointer4;
  local_48[4] = pointer5;
  local_48[5] = pointer6;
  lVar2 = 0;
  do {
    ppcVar1 = local_48[lVar2];
    if ((ppcVar1 != (char **)0x0) && (*ppcVar1 != (char *)0x0)) {
      free(*ppcVar1);
      *ppcVar1 = (char *)0x0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  return;
}

Assistant:

void FreeBufferOnError(
    char** pointer1, char** pointer2, char** pointer3, char** pointer4,
    char** pointer5, char** pointer6) {
  char** pointer_list[] = {pointer1, pointer2, pointer3,
                           pointer4, pointer5, pointer6};
  for (size_t idx = 0; idx < 6; ++idx) {
    if (pointer_list[idx] != nullptr) {
      if (*(pointer_list[idx]) != nullptr) {
        ::free(*(pointer_list[idx]));
        *(pointer_list[idx]) = nullptr;
      }
    }
  }
}